

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O0

int32_t uhash_puti_63(UHashtable *hash,void *key,int32_t value,UErrorCode *status)

{
  UHashTok UVar1;
  undefined4 local_40;
  undefined4 uStack_34;
  UHashTok valueholder;
  UHashTok keyholder;
  UErrorCode *status_local;
  int32_t value_local;
  void *key_local;
  UHashtable *hash_local;
  
  UVar1._4_4_ = uStack_34;
  UVar1.integer = value;
  UVar1 = _uhash_put(hash,key,UVar1,'\x01',status);
  local_40 = UVar1.integer;
  return local_40;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uhash_puti(UHashtable *hash,
           void* key,
           int32_t value,
           UErrorCode *status) {
    UHashTok keyholder, valueholder;
    keyholder.pointer = key;
    valueholder.integer = value;
    return _uhash_put(hash, keyholder, valueholder,
                      HINT_KEY_POINTER,
                      status).integer;
}